

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O2

void __thiscall Rml::ElementScroll::DisableScrollbar(ElementScroll *this,Orientation orientation)

{
  Element *pEVar1;
  Property local_70;
  
  if (this->scrollbars[orientation].enabled == true) {
    pEVar1 = this->scrollbars[orientation].element;
    Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>(&local_70,Hidden);
    Element::SetProperty(pEVar1,Visibility,&local_70);
    Property::~Property(&local_70);
    this->scrollbars[orientation].enabled = false;
    pEVar1 = this->corner;
    if (pEVar1 != (Element *)0x0) {
      Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>(&local_70,Hidden);
      Element::SetProperty(pEVar1,Visibility,&local_70);
      Property::~Property(&local_70);
    }
  }
  return;
}

Assistant:

void ElementScroll::DisableScrollbar(Orientation orientation)
{
	if (scrollbars[orientation].enabled)
	{
		scrollbars[orientation].element->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));
		scrollbars[orientation].enabled = false;

		if (corner)
			corner->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));
	}
}